

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int derive_exporter_secret(ptls_t *tls,int is_early)

{
  long lVar1;
  ptls_key_schedule_t *sched;
  int iVar2;
  void *secret;
  char *pcVar3;
  ptls_iovec_t secret_00;
  
  iVar2 = 0;
  if ((tls->ctx->field_0x68 & 2) == 0) {
    if (*(long *)(tls->client_random + (ulong)(is_early == 0) * 8 + 0x28) != 0) {
      __assert_fail("*slot == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x3d3,"int derive_exporter_secret(ptls_t *, int)");
    }
    lVar1 = (ulong)(is_early == 0) * 8;
    sched = tls->key_schedule;
    secret = malloc((sched->hashes[0].algo)->digest_size);
    *(void **)(tls->client_random + lVar1 + 0x28) = secret;
    if (secret == (void *)0x0) {
      iVar2 = 0x201;
    }
    else {
      pcVar3 = "e exp master";
      if (is_early == 0) {
        pcVar3 = "exp master";
      }
      iVar2 = derive_secret(sched,secret,pcVar3);
      if (iVar2 == 0) {
        pcVar3 = "EARLY_EXPORTER_SECRET";
        if (is_early == 0) {
          pcVar3 = "EXPORTER_SECRET";
        }
        secret_00.len = (tls->key_schedule->hashes[0].algo)->digest_size;
        secret_00.base = *(uint8_t **)(tls->client_random + lVar1 + 0x28);
        log_secret(tls,pcVar3,secret_00);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int derive_exporter_secret(ptls_t *tls, int is_early)
{
    int ret;

    if (tls->ctx->use_exporter)
        return 0;

    uint8_t **slot = is_early ? &tls->exporter_master_secret.early : &tls->exporter_master_secret.one_rtt;
    assert(*slot == NULL);
    if ((*slot = malloc(tls->key_schedule->hashes[0].algo->digest_size)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if ((ret = derive_secret(tls->key_schedule, *slot, is_early ? "e exp master" : "exp master")) != 0)
        return ret;

    log_secret(tls, is_early ? "EARLY_EXPORTER_SECRET" : "EXPORTER_SECRET",
               ptls_iovec_init(*slot, tls->key_schedule->hashes[0].algo->digest_size));

    return 0;
}